

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

pair<spvtools::opt::SExpression,_long> * __thiscall
spvtools::opt::SExpression::operator/
          (pair<spvtools::opt::SExpression,_long> *__return_storage_ptr__,SExpression *this,
          SExpression rhs_wrapper)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar2;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ChildContainerType *this_00;
  size_type sVar3;
  undefined4 extraout_var_06;
  int local_7c;
  SENode *local_78;
  int local_6c;
  SENode *local_68;
  SENode *res;
  SENode *local_58;
  long local_50;
  int64_t rhs_value;
  int64_t lhs_value;
  SENode *local_38;
  SENode *local_30;
  SENode *rhs;
  SENode *lhs;
  SExpression *this_local;
  SExpression rhs_wrapper_local;
  
  rhs_wrapper_local.node_ = (SENode *)rhs_wrapper.scev_;
  local_30 = rhs_wrapper.node_;
  rhs = this->node_;
  lhs = (SENode *)this;
  this_local = (SExpression *)local_30;
  iVar1 = (*local_30->_vptr_SENode[4])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*local_30->_vptr_SENode[4])();
    iVar2 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var_00,iVar1));
    if (iVar2 == 0) {
      local_38 = ScalarEvolutionAnalysis::CreateCantComputeNode(this->scev_);
      lhs_value._4_4_ = 0;
      std::pair<spvtools::opt::SExpression,_long>::pair<spvtools::opt::SENode_*,_int,_true>
                (__return_storage_ptr__,&local_38,(int *)((long)&lhs_value + 4));
      return __return_storage_ptr__;
    }
  }
  iVar1 = (*rhs->_vptr_SENode[4])();
  if ((CONCAT44(extraout_var_01,iVar1) == 0) ||
     (iVar1 = (*local_30->_vptr_SENode[4])(), CONCAT44(extraout_var_02,iVar1) == 0)) {
    iVar1 = (*rhs->_vptr_SENode[10])();
    if (CONCAT44(extraout_var_05,iVar1) != 0) {
      this_00 = SENode::GetChildren(rhs);
      sVar3 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::size
                        (this_00);
      if (sVar3 != 2) {
        __assert_fail("lhs->GetChildren().size() == 2 && \"More than 2 operand for a multiply node.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                      ,0x3d0,
                      "std::pair<SExpression, int64_t> spvtools::opt::SExpression::operator/(SExpression) const"
                     );
      }
      iVar1 = (*rhs->_vptr_SENode[10])();
      local_68 = anon_unknown_15::RemoveOneNodeFromMultiplyChain
                           ((SEMultiplyNode *)CONCAT44(extraout_var_06,iVar1),local_30);
      if (local_68 != rhs) {
        local_6c = 0;
        std::pair<spvtools::opt::SExpression,_long>::pair<spvtools::opt::SENode_*&,_int,_true>
                  (__return_storage_ptr__,&local_68,&local_6c);
        return __return_storage_ptr__;
      }
    }
    local_78 = ScalarEvolutionAnalysis::CreateCantComputeNode(this->scev_);
    local_7c = 0;
    std::pair<spvtools::opt::SExpression,_long>::pair<spvtools::opt::SENode_*,_int,_true>
              (__return_storage_ptr__,&local_78,&local_7c);
  }
  else {
    iVar1 = (*rhs->_vptr_SENode[4])();
    rhs_value = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var_03,iVar1))
    ;
    iVar1 = (*local_30->_vptr_SENode[4])();
    local_50 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var_04,iVar1));
    local_58 = ScalarEvolutionAnalysis::CreateConstant(this->scev_,rhs_value / local_50);
    res = (SENode *)(rhs_value % local_50);
    std::pair<spvtools::opt::SExpression,_long>::pair<spvtools::opt::SENode_*,_long,_true>
              (__return_storage_ptr__,&local_58,(long *)&res);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<SExpression, int64_t> SExpression::operator/(
    SExpression rhs_wrapper) const {
  SENode* lhs = node_;
  SENode* rhs = rhs_wrapper.node_;
  // Check for division by 0.
  if (rhs->AsSEConstantNode() &&
      !rhs->AsSEConstantNode()->FoldToSingleValue()) {
    return {scev_->CreateCantComputeNode(), 0};
  }

  // Trivial case.
  if (lhs->AsSEConstantNode() && rhs->AsSEConstantNode()) {
    int64_t lhs_value = lhs->AsSEConstantNode()->FoldToSingleValue();
    int64_t rhs_value = rhs->AsSEConstantNode()->FoldToSingleValue();
    return {scev_->CreateConstant(lhs_value / rhs_value),
            lhs_value % rhs_value};
  }

  // look for a "c U / U" pattern.
  if (lhs->AsSEMultiplyNode()) {
    assert(lhs->GetChildren().size() == 2 &&
           "More than 2 operand for a multiply node.");
    SENode* res = RemoveOneNodeFromMultiplyChain(lhs->AsSEMultiplyNode(), rhs);
    if (res != lhs) {
      return {res, 0};
    }
  }

  return {scev_->CreateCantComputeNode(), 0};
}